

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::linked_ptr
          (linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *this,
          linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *ptr)

{
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *ptr_local;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *this_local;
  
  if (ptr != this) {
    linked_ptr<testing::MatcherInterface<unsigned_long>const>::
    copy<testing::MatcherInterface<unsigned_long>const>
              ((linked_ptr<testing::MatcherInterface<unsigned_long>const> *)this,ptr);
    return;
  }
  __assert_fail("&ptr != this",
                "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/3rd-party/gmock-1.7.0/gtest/gtest.h"
                ,0x2394,
                "testing::internal::linked_ptr<const testing::MatcherInterface<unsigned long>>::linked_ptr(const linked_ptr<T> &) [T = const testing::MatcherInterface<unsigned long>]"
               );
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }